

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

Cell __thiscall cppforth::Forth::dataSpaceAtCell(Forth *this,Cell index)

{
  pointer puVar1;
  uint uVar2;
  byte bVar3;
  pointer pVVar4;
  ulong uVar5;
  ulong uVar6;
  
  pVVar4 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pVVar4 == (this->VirtualMemory).
                  super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return 0;
    }
    if ((pVVar4->start <= index) && (index < pVVar4->end)) break;
    pVVar4 = pVVar4 + 1;
  }
  puVar1 = (pVVar4->segment).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  bVar3 = 0;
  uVar6 = 0;
  uVar2 = 0;
  while( true ) {
    uVar5 = (ulong)((index - pVVar4->start) + (int)uVar6);
    if ((ulong)((long)(pVVar4->segment).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1) <= uVar5) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    uVar2 = uVar2 | (uint)puVar1[uVar5] << (bVar3 & 0x1f);
    if (2 < uVar6) break;
    uVar5 = (ulong)index + 1 + uVar6;
    uVar6 = uVar6 + 1;
    bVar3 = bVar3 + 8;
    if (pVVar4->end <= uVar5) {
      return uVar2;
    }
  }
  return uVar2;
}

Assistant:

Cell dataSpaceAtCell(Cell index){
			for (auto it = VirtualMemory.begin(), itend=VirtualMemory.end(); it != itend ; ++it){
				if ((*it).start <= index && (*it).end > index){
					Cell tmp{ 0 }, tmpRes{ 0 };
					for (size_t i = 0; i < sizeof(Cell) && (*it).end > index; ++i,++index){
						tmp=(*it).segment.at(index - (*it).start) ;
						tmp <<= 8*i;
						tmpRes |= tmp;
					}
					return tmpRes;		
				}
			}
			return Cell(0); // all memory is filled by 0x00
		}